

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  came_from;
  vector<double,_std::allocator<double>_> start;
  maze_s final;
  ostream *poVar5;
  int j;
  ulong uVar6;
  int i;
  uint uVar7;
  ulong uVar8;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> show_path;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  GRID;
  _Vector_base<double,_std::allocator<double>_> local_118;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  local_100;
  _Vector_base<int,_std::allocator<int>_> local_e8;
  _Vector_base<double,_std::allocator<double>_> local_d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_b8;
  HBF hbf;
  maze_path get_path;
  
  makeBlankGrid(&GRID,0x10);
  poVar5 = std::operator<<((ostream *)&std::cout,"Finding path through grid:");
  std::endl<char,std::char_traits<char>>(poVar5);
  for (uVar8 = 0;
      uVar8 < (ulong)(((long)GRID.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)GRID.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar8 = uVar8 + 1) {
    std::ostream::operator<<
              ((ostream *)&std::cout,
               *GRID.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start);
    for (uVar6 = 1;
        uVar6 < (ulong)((long)((GRID.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)((GRID.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar6 = uVar6 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,",");
      std::ostream::operator<<
                (poVar5,GRID.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar8].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6]);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  HBF::HBF(&hbf);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_b8,&GRID);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_d0,&START);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_e8,&GOAL);
  HBF::search(&get_path,&hbf,&local_b8,(vector<double,_std::allocator<double>_> *)&local_d0,
              (vector<int,_std::allocator<int>_> *)&local_e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_e8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::vector(&local_100,&get_path.came_from);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_118,&START);
  came_from.
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)get_path.final.x;
  came_from.
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)get_path.final.g;
  came_from.
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)get_path.final.y;
  start.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = &(show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                super__Vector_impl_data._M_start)->g;
  start.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)get_path.final.theta;
  start.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       &(show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
         super__Vector_impl_data._M_finish)->g;
  final.x = (double)GRID.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  final.g = (double)show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
  final.y = (double)GRID.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  final.theta = (double)GRID.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  HBF::reconstruct_path(&show_path,&hbf,came_from,start,final);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_118);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::~vector(&local_100);
  poVar5 = std::operator<<((ostream *)&std::cout,"steps: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"show path from start to finish");
  std::endl<char,std::char_traits<char>>(poVar5);
  uVar8 = (ulong)((long)show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff;
  while( true ) {
    uVar8 = uVar8 - 1;
    if ((int)(uint)uVar8 < 0) break;
    uVar7 = (uint)uVar8 & 0x7fffffff;
    dVar1 = show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7].g;
    dVar2 = show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7].x;
    dVar3 = show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7].y;
    dVar4 = show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7].theta;
    poVar5 = std::operator<<((ostream *)&std::cout,"##### step ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," #####");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)&std::cout,"g ");
    poVar5 = std::ostream::_M_insert<double>(dVar1);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)&std::cout,"x ");
    poVar5 = std::ostream::_M_insert<double>(dVar2);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)&std::cout,"y ");
    poVar5 = std::ostream::_M_insert<double>(dVar3);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)&std::cout,"theta ");
    poVar5 = std::ostream::_M_insert<double>(dVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::_Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>::~_Vector_base
            (&show_path.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>);
  HBF::maze_path::~maze_path(&get_path);
  HBF::~HBF(&hbf);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&GRID);
  return 0;
}

Assistant:

int main() {

    vector< vector<int> > GRID = makeBlankGrid(16);

    cout << "Finding path through grid:" << endl;

    // TODO:: Create an Empty Maze and try testing the number of expansions with it

    for (int i = 0; i < GRID.size(); i++) {
        cout << GRID[i][0];
        for (int j = 1; j < GRID[0].size(); j++) {
            cout << "," << GRID[i][j];
        }
        cout << endl;
    }

    HBF hbf = HBF();

//    vector<vector<double> > heuristic = hbf.heuristic_basic(GRID, START, GOAL);
//    vector<vector<double> > heuristic = hbf.heuristic_nhh_euclidean(GRID, GOAL);
//    vector<vector<double> > heuristic = hbf.heuristic_nhh_manhattan(GRID, GOAL);

/*    cout << "Check my heuristic function. " << endl;
    for (int i = 0; i < heuristic.size(); i++) {
        cout << heuristic[i][0];
        for (int j = 1; j < heuristic[0].size(); j++) {
            cout << "," << heuristic[i][j];
        }
        cout << endl;
    }*/

    HBF::maze_path get_path = hbf.search(GRID, START, GOAL);

    vector<HBF::maze_s> show_path = hbf.reconstruct_path(get_path.came_from, START, get_path.final);

    cout << "steps: " <<show_path.size() << endl;
    cout << "show path from start to finish" << endl;
    for (int i = show_path.size() - 1; i >= 0; i--) {

        HBF::maze_s step = show_path[i];
        cout << "##### step " << show_path.size()-i << " #####" << endl;
        cout << "g " << step.g << endl;
        cout << "x " << step.x << endl;
        cout << "y " << step.y << endl;
        cout << "theta " << step.theta << endl;

    }

    return 0;
}